

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::ToExponential
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  int requested_digits_00;
  bool bVar1;
  bool sign;
  int decimal_rep_length;
  int decimal_point;
  char decimal_rep [122];
  bool local_b9;
  int local_b8;
  int local_b4;
  double local_b0;
  char local_a8 [128];
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    bVar1 = HandleSpecialValues(this,value,result_builder);
    return bVar1;
  }
  if (requested_digits - 0x79U < 0xffffff86) {
    bVar1 = false;
  }
  else {
    local_b0 = value;
    if (requested_digits == -1) {
      DoubleToAscii(value,SHORTEST,0,local_a8,0x7a,&local_b9,&local_b8,&local_b4);
      requested_digits_00 = local_b8;
    }
    else {
      requested_digits_00 = requested_digits + 1;
      DoubleToAscii(value,PRECISION,requested_digits_00,local_a8,0x7a,&local_b9,&local_b8,&local_b4)
      ;
      if (requested_digits_00 < local_b8) {
        __assert_fail("decimal_rep_length <= requested_digits + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x106,
                      "bool FIX::double_conversion::DoubleToStringConverter::ToExponential(double, int, StringBuilder *) const"
                     );
      }
      if (local_b8 <= requested_digits) {
        memset(local_a8 + local_b8,0x30,(ulong)(uint)(requested_digits - local_b8) + 1);
      }
    }
    local_b8 = requested_digits_00;
    if ((local_b9 == true) && (local_b0 != 0.0 || (this->flags_ & 8U) == 0)) {
      StringBuilder::AddCharacter(result_builder,'-');
    }
    CreateExponentialRepresentation(this,local_a8,local_b8,local_b4 + -1,result_builder);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool DoubleToStringConverter::ToExponential(
    double value,
    int requested_digits,
    StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits < -1) return false;
  if (requested_digits > kMaxExponentialDigits) return false;

  int decimal_point;
  bool sign;
  // Add space for digit before the decimal point and the '\0' character.
  const int kDecimalRepCapacity = kMaxExponentialDigits + 2;
  ASSERT(kDecimalRepCapacity > kBase10MaximalLength);
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  if (requested_digits == -1) {
    DoubleToAscii(value, SHORTEST, 0,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
  } else {
    DoubleToAscii(value, PRECISION, requested_digits + 1,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
    ASSERT(decimal_rep_length <= requested_digits + 1);

    for (int i = decimal_rep_length; i < requested_digits + 1; ++i) {
      decimal_rep[i] = '0';
    }
    decimal_rep_length = requested_digits + 1;
  }

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  CreateExponentialRepresentation(decimal_rep,
                                  decimal_rep_length,
                                  exponent,
                                  result_builder);
  return true;
}